

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O3

void flatcc_json_printer_table_as_nested_root
               (flatcc_json_printer_t *ctx,flatcc_json_printer_table_descriptor_t *td,int id,
               char *name,size_t len,char *fid,flatcc_json_printer_table_f *pf)

{
  uint *buf;
  int iVar1;
  uint uVar2;
  long lVar3;
  char *__s;
  ulong uVar4;
  char *pcVar5;
  size_t __n;
  flatcc_json_printer_table_descriptor_t local_48;
  
  uVar2 = id * 2 + 4;
  if (uVar2 < (uint)td->vsize) {
    uVar4 = (ulong)*(ushort *)((long)td->vtable + (ulong)uVar2);
    if (uVar4 != 0) {
      buf = (uint *)((long)td->table + (ulong)*(uint *)((long)td->table + uVar4) + 4 + uVar4);
      accept_header(ctx,buf,(ulong)buf[-1],fid);
      iVar1 = td->count;
      td->count = iVar1 + 1;
      if (iVar1 != 0) {
        pcVar5 = ctx->p;
        ctx->p = pcVar5 + 1;
        *pcVar5 = ',';
      }
      print_name(ctx,name,len);
      local_48.ttl = td->ttl + -1;
      if (local_48.ttl == 0) {
        if (ctx->error == 0) {
          ctx->error = 2;
        }
      }
      else {
        uVar2 = *buf;
        local_48.table = (void *)((long)buf + (ulong)uVar2);
        ctx->level = ctx->level + 1;
        pcVar5 = ctx->p;
        ctx->p = pcVar5 + 1;
        *pcVar5 = '{';
        local_48.count = 0;
        local_48.vtable = (void *)((long)local_48.table - (long)*(int *)((long)buf + (ulong)uVar2));
        local_48.vsize = (int)*local_48.vtable;
        (*pf)(ctx,&local_48);
        pcVar5 = ctx->p;
        if (ctx->indent != '\0') {
          ctx->p = pcVar5 + 1;
          *pcVar5 = '\n';
          lVar3 = (long)ctx->level + -1;
          ctx->level = (int)lVar3;
          uVar4 = (ulong)ctx->indent * lVar3;
          pcVar5 = ctx->pflush;
          __s = ctx->p;
          if (pcVar5 < __s + uVar4) {
            if (pcVar5 <= __s) {
              (*ctx->flush)(ctx,0);
              pcVar5 = ctx->pflush;
              __s = ctx->p;
            }
            __n = (long)pcVar5 - (long)__s;
            if (__n < uVar4) {
              do {
                memset(__s,0x20,__n);
                ctx->p = ctx->p + __n;
                uVar4 = uVar4 - __n;
                (*ctx->flush)(ctx,0);
                __s = ctx->p;
                __n = (long)ctx->pflush - (long)__s;
              } while (__n < uVar4);
            }
          }
          memset(__s,0x20,uVar4);
          pcVar5 = ctx->p + uVar4;
        }
        ctx->p = pcVar5 + 1;
        *pcVar5 = '}';
      }
    }
  }
  return;
}

Assistant:

void flatcc_json_printer_table_as_nested_root(flatcc_json_printer_t *ctx,
        flatcc_json_printer_table_descriptor_t *td,
        int id, const char *name, size_t len,
        const char *fid,
        flatcc_json_printer_table_f pf)
{
    const uoffset_t *buf;
    uoffset_t bufsiz;

    if (0 == (buf = get_field_ptr(td, id))) {
        return;
    }
    buf = (const uoffset_t *)((size_t)buf + __flatbuffers_uoffset_read_from_pe(buf));
    bufsiz = __flatbuffers_uoffset_read_from_pe(buf);
    ++buf;
    if (!accept_header(ctx, buf, bufsiz, fid)) {
        return;
    }
    if (td->count++) {
        print_char(',');
    }
    print_name(ctx, name, len);
    print_table_object(ctx, read_uoffset_ptr(buf), td->ttl, pf);
}